

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::inherit_expression_dependencies
          (Compiler *this,uint32_t dst,uint32_t source_expression)

{
  bool bVar1;
  SPIRExpression *pSVar2;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *pSVar3;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar4;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar5;
  TypedID<(diligent_spirv_cross::Types)0> *insert_end;
  bool local_a9;
  TypedID<(diligent_spirv_cross::Types)0> local_84;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *local_80;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *s_deps;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *e_deps;
  SPIRExpression *s;
  SPIRVariable *local_60;
  SPIRVariable *phi;
  SPIRExpression *e;
  _Node_iterator_base<unsigned_int,_false> local_48;
  _Node_iterator_base<unsigned_int,_false> local_40;
  _Node_iterator_base<unsigned_int,_false> local_38;
  TypedID<(diligent_spirv_cross::Types)0> local_2c;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *local_28;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *deps;
  SPIRExpression *ptr_e;
  uint32_t source_expression_local;
  uint32_t dst_local;
  Compiler *this_local;
  
  ptr_e._0_4_ = source_expression;
  ptr_e._4_4_ = dst;
  _source_expression_local = this;
  deps = (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
         maybe_get<diligent_spirv_cross::SPIRExpression>(this,dst);
  bVar1 = is_position_invariant(this);
  if (((bVar1) &&
      (deps != (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
               0x0)) &&
     (pSVar2 = maybe_get<diligent_spirv_cross::SPIRExpression>(this,(uint32_t)ptr_e),
     pSVar2 != (SPIRExpression *)0x0)) {
    local_28 = (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
               &deps[2].
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                buffer_size;
    pTVar4 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::begin
                       ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                         *)local_28);
    pTVar5 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::end
                       (&local_28->
                         super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                       );
    pTVar4 = ::std::
             find<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,unsigned_int>
                       (pTVar4,pTVar5,(uint *)&ptr_e);
    pTVar5 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::end
                       (&local_28->
                         super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                       );
    pSVar3 = local_28;
    if (pTVar4 == pTVar5) {
      TypedID<(diligent_spirv_cross::Types)0>::TypedID(&local_2c,(uint32_t)ptr_e);
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
                (pSVar3,&local_2c);
    }
  }
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(&this->forwarded_temporaries,(key_type *)((long)&ptr_e + 4));
  local_40._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                 (&this->forwarded_temporaries);
  bVar1 = ::std::__detail::operator==(&local_38,&local_40);
  local_a9 = true;
  if (!bVar1) {
    local_48._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(&this->forced_temporaries,(key_type *)((long)&ptr_e + 4));
    e = (SPIRExpression *)
        ::std::
        end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                  (&this->forced_temporaries);
    local_a9 = ::std::__detail::operator!=(&local_48,(_Node_iterator_base<unsigned_int,_false> *)&e)
    ;
  }
  if (local_a9 == false) {
    phi = (SPIRVariable *)deps;
    local_60 = maybe_get<diligent_spirv_cross::SPIRVariable>(this,(uint32_t)ptr_e);
    if ((local_60 != (SPIRVariable *)0x0) && ((local_60->phi_variable & 1U) != 0)) {
      pSVar3 = &local_60->dependees;
      TypedID<(diligent_spirv_cross::Types)0>::TypedID
                ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&s + 4),ptr_e._4_4_);
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
                (pSVar3,(TypedID<(diligent_spirv_cross::Types)0> *)((long)&s + 4));
    }
    e_deps = (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
             maybe_get<diligent_spirv_cross::SPIRExpression>(this,(uint32_t)ptr_e);
    if ((SPIRExpression *)e_deps != (SPIRExpression *)0x0) {
      pSVar3 = (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
               ((phi->dereference_chain).stack_storage.aligned_char + 8);
      local_80 = &((SPIRExpression *)e_deps)->expression_dependencies;
      s_deps = pSVar3;
      TypedID<(diligent_spirv_cross::Types)0>::TypedID(&local_84,(uint32_t)ptr_e);
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
                (pSVar3,&local_84);
      pSVar3 = s_deps;
      pTVar4 = ::std::
               end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         (s_deps);
      pTVar5 = ::std::
               begin<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         (local_80);
      insert_end = ::std::
                   end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                             (local_80);
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::insert
                (pSVar3,pTVar4,pTVar5,insert_end);
      pTVar4 = ::std::
               begin<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         (s_deps);
      pTVar5 = ::std::
               end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         (s_deps);
      ::std::sort<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*>(pTVar4,pTVar5);
      pSVar3 = s_deps;
      pTVar4 = ::std::
               begin<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         (s_deps);
      pTVar5 = ::std::
               end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         (s_deps);
      pTVar4 = ::std::unique<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*>
                         (pTVar4,pTVar5);
      pTVar5 = ::std::
               end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,8ul>>
                         (s_deps);
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::erase
                (pSVar3,pTVar4,pTVar5);
    }
  }
  return;
}

Assistant:

void Compiler::inherit_expression_dependencies(uint32_t dst, uint32_t source_expression)
{
	auto *ptr_e = maybe_get<SPIRExpression>(dst);

	if (is_position_invariant() && ptr_e && maybe_get<SPIRExpression>(source_expression))
	{
		auto &deps = ptr_e->invariance_dependencies;
		if (std::find(deps.begin(), deps.end(), source_expression) == deps.end())
			deps.push_back(source_expression);
	}

	// Don't inherit any expression dependencies if the expression in dst
	// is not a forwarded temporary.
	if (forwarded_temporaries.find(dst) == end(forwarded_temporaries) ||
	    forced_temporaries.find(dst) != end(forced_temporaries))
	{
		return;
	}

	auto &e = *ptr_e;
	auto *phi = maybe_get<SPIRVariable>(source_expression);
	if (phi && phi->phi_variable)
	{
		// We have used a phi variable, which can change at the end of the block,
		// so make sure we take a dependency on this phi variable.
		phi->dependees.push_back(dst);
	}

	auto *s = maybe_get<SPIRExpression>(source_expression);
	if (!s)
		return;

	auto &e_deps = e.expression_dependencies;
	auto &s_deps = s->expression_dependencies;

	// If we depend on a expression, we also depend on all sub-dependencies from source.
	e_deps.push_back(source_expression);
	e_deps.insert(end(e_deps), begin(s_deps), end(s_deps));

	// Eliminate duplicated dependencies.
	sort(begin(e_deps), end(e_deps));
	e_deps.erase(unique(begin(e_deps), end(e_deps)), end(e_deps));
}